

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_morph.cpp
# Opt level: O1

PClass * __thiscall AMorphProjectile::StaticType(AMorphProjectile *this)

{
  return RegistrationInfo.MyClass;
}

Assistant:

int AMorphProjectile::DoSpecialDamage (AActor *target, int damage, FName damagetype)
{
	PClassActor *morph_flash = PClass::FindActor(MorphFlash);
	PClassActor *unmorph_flash = PClass::FindActor(UnMorphFlash);
	if (target->player)
	{
		PClassPlayerPawn *player_class = dyn_cast<PClassPlayerPawn>(PClass::FindClass(PlayerClass));
		P_MorphPlayer (NULL, target->player, player_class, Duration, MorphStyle, morph_flash, unmorph_flash);
	}
	else
	{
		PClassActor *monster_class = PClass::FindActor(MonsterClass);
		P_MorphMonster (target, monster_class, Duration, MorphStyle, morph_flash, unmorph_flash);
	}
	return -1;
}